

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O0

optional_idx __thiscall
duckdb::FunctionBinder::MultipleCandidateException<duckdb::ScalarFunction>
          (FunctionBinder *this,string *name,FunctionSet<duckdb::ScalarFunction> *functions,
          vector<unsigned_long,_true> *candidate_functions,
          vector<duckdb::LogicalType,_true> *arguments,ErrorData *error)

{
  bool bVar1;
  undefined8 in_RCX;
  FunctionSet<duckdb::ScalarFunction> *in_RSI;
  ScalarFunction f;
  unsigned_long *conf;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_true> *__range2;
  string candidate_str;
  string call_str;
  BaseScalarFunction *in_stack_fffffffffffffc88;
  ScalarFunction *in_stack_fffffffffffffc90;
  ErrorData *this_00;
  LogicalType *in_stack_fffffffffffffcb0;
  string *in_stack_fffffffffffffcd0;
  ExceptionType in_stack_fffffffffffffcdf;
  ErrorData *in_stack_fffffffffffffce0;
  allocator<char> local_309;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  string *in_stack_fffffffffffffd08;
  string local_2e8 [32];
  ErrorData local_2c8;
  string local_248 [32];
  LogicalType *in_stack_fffffffffffffdd8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffde8;
  string local_208 [328];
  reference local_c0;
  unsigned_long *local_b8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_b0;
  undefined8 local_a8;
  string local_a0 [48];
  undefined1 local_70 [24];
  string local_58 [48];
  undefined8 local_28;
  optional_idx local_8;
  
  local_28 = in_RCX;
  LogicalType::LogicalType(in_stack_fffffffffffffcb0,(LogicalTypeId)((ulong)local_70 >> 0x38));
  Function::CallToString
            (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  LogicalType::~LogicalType((LogicalType *)0x28b300);
  ::std::__cxx11::string::string(local_a0);
  local_a8 = local_28;
  local_b0._M_current =
       (unsigned_long *)
       ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc88
                 );
  local_b8 = (unsigned_long *)
             ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffc88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffc90,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffc88);
    if (!bVar1) break;
    local_c0 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_b0);
    FunctionSet<duckdb::ScalarFunction>::GetFunctionByOffset
              (in_RSI,(idx_t)in_stack_fffffffffffffc90);
    BaseScalarFunction::ToString_abi_cxx11_(in_stack_fffffffffffffc88);
    ::std::operator+((char *)in_RSI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc90);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
                     (char *)in_stack_fffffffffffffc90);
    ::std::__cxx11::string::operator+=(local_a0,local_208);
    ::std::__cxx11::string::~string(local_208);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
    ::std::__cxx11::string::~string(local_248);
    ScalarFunction::~ScalarFunction(in_stack_fffffffffffffc90);
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_b0);
  }
  this_00 = (ErrorData *)&local_309;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffcf8,
             "Could not choose a best candidate function for the function call \"%s\". In order to select one, please add explicit type casts.\n\tCandidate functions:\n%s"
             ,(allocator *)this_00);
  ::std::__cxx11::string::string((string *)&stack0xfffffffffffffcd0,local_58);
  ::std::__cxx11::string::string((string *)&stack0xfffffffffffffcb0,local_a0);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  ErrorData::ErrorData
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd0);
  ErrorData::operator=(this_00,&local_2c8);
  ErrorData::~ErrorData(this_00);
  ::std::__cxx11::string::~string(local_2e8);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffcb0);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffcd0);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffcf8);
  ::std::allocator<char>::~allocator(&local_309);
  optional_idx::optional_idx(&local_8);
  ::std::__cxx11::string::~string(local_a0);
  ::std::__cxx11::string::~string(local_58);
  return (optional_idx)local_8.index;
}

Assistant:

optional_idx FunctionBinder::MultipleCandidateException(const string &name, FunctionSet<T> &functions,
                                                        vector<idx_t> &candidate_functions,
                                                        const vector<LogicalType> &arguments, ErrorData &error) {
	D_ASSERT(functions.functions.size() > 1);
	// there are multiple possible function definitions
	// throw an exception explaining which overloads are there
	string call_str = Function::CallToString(name, arguments);
	string candidate_str;
	for (auto &conf : candidate_functions) {
		T f = functions.GetFunctionByOffset(conf);
		candidate_str += "\t" + f.ToString() + "\n";
	}
	error = ErrorData(
	    ExceptionType::BINDER,
	    StringUtil::Format("Could not choose a best candidate function for the function call \"%s\". In order to "
	                       "select one, please add explicit type casts.\n\tCandidate functions:\n%s",
	                       call_str, candidate_str));
	return optional_idx();
}